

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::append(QString *this,QString *str)

{
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 str_00;
  long len;
  QAnyStringView s;
  
  str_00 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(str->d).ptr;
  if ((QChar *)str_00.m_data != (QChar *)0x0) {
    if ((this->d).ptr == (char16_t *)0x0) {
      if ((str->d).d == (Data *)0x0) {
        s.m_size = (str->d).size * 4 + 2;
        s.field_0.m_data_utf16 = (char16_t *)str_00.m_data;
        assign(this,s);
      }
      else {
        QArrayDataPointer<char16_t>::operator=(&this->d,&str->d);
      }
    }
    else {
      len = (str->d).size;
      if (len != 0) {
        append(this,(QChar *)str_00.m_data_utf16,len);
      }
    }
  }
  return this;
}

Assistant:

QString &QString::append(const QString &str)
{
    if (!str.isNull()) {
        if (isNull()) {
            if (Q_UNLIKELY(!str.d.isMutable()))
                assign(str); // fromRawData, so we do a deep copy
            else
                operator=(str);
        } else if (str.size()) {
            append(str.constData(), str.size());
        }
    }
    return *this;
}